

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

Path * __thiscall Pathie::Path::prune(Path *__return_storage_ptr__,Path *this)

{
  bool bVar1;
  ulong uVar2;
  string newpath;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&newpath,(string *)this);
LAB_0010a284:
  do {
    uVar2 = std::__cxx11::string::find((char *)&newpath,0x10f0f1);
    if (uVar2 == 0xffffffffffffffff) {
      if (newpath._M_string_length == 0) {
        std::__cxx11::string::assign((char *)&newpath);
      }
      std::__cxx11::string::string((string *)&local_70,(string *)&newpath);
      Path(__return_storage_ptr__,&local_70);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      return __return_storage_ptr__;
    }
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&newpath);
    bVar1 = std::operator==(&local_50,"/..");
    std::__cxx11::string::_M_dispose();
    if (bVar1) goto code_r0x0010a2d3;
  } while ((uVar2 + 2 < newpath._M_string_length) && (newpath._M_dataplus._M_p[uVar2 + 2] != '/'));
  std::__cxx11::string::erase((ulong)&newpath,uVar2);
  goto LAB_0010a363;
code_r0x0010a2d3:
  if ((newpath._M_string_length <= uVar2 + 3) || (newpath._M_dataplus._M_p[uVar2 + 3] == '/')) {
    if (uVar2 == 0) {
      std::__cxx11::string::erase((ulong)&newpath,0);
LAB_0010a363:
      if (newpath._M_string_length == 0) {
        std::__cxx11::string::append((char *)&newpath);
      }
    }
    else {
      uVar2 = std::__cxx11::string::rfind((char *)&newpath,0x10f18c);
      if (uVar2 == 0xffffffffffffffff) {
        uVar2 = 0;
      }
      std::__cxx11::string::erase((ulong)&newpath,uVar2);
    }
  }
  goto LAB_0010a284;
}

Assistant:

Path Path::prune() const
{
  std::string newpath(m_path); // copy
  size_t pos = 0;
  while((pos = newpath.find("/.", pos)) != string::npos) { // assignment intended
    if (newpath.substr(pos, 3) == "/..") {

      // Weird path like /..foo or foo/..bar, which are NOT relative paths
      if (newpath.length() > pos + 3 && newpath[pos + 3] != '/') {
        // Do not reset `pos' -- this has to stay. Advance to the next char.
        pos++;
        continue;
      }

      if (pos == 0) {
        // /.. at beginning of string, replace with root / (/ on Windows is root on current drive)
        newpath.erase(pos, 3);

        // Whoops -- the entire string was just "/.."
        if (newpath.empty()) {
          newpath.append("/");
        }
      }
#ifdef _WIN32
      // Cater for paths with drive X:/ on Windows
      else if (pos == 2 && newpath[1] == ':') { // ":" is on Windows only allowed at pos 1, where it signifies the preceding char is a drive letter
        // X:/. or X:/.. at beginning of string
        if(newpath.length() > 4 && newpath[4] == '.') { // X:/..
          // Prevent special case "X:/..foo", which is directory "..foo" under the root
          if (newpath.length() <= 5 || newpath[5] != '/') {
            // X:/.. or X:/../foo/bar at beginning of string, replace with drive root
            newpath.erase(pos, 3);
          }
        }
        else { // X:/./foo/bar X:/..foo
          // Prevent special case "X:/.foo", which is directory ".foo" under the root
          if (newpath.length() <= 4 || newpath[4] != '/') {
            // X:/. or X:/./foo/bar at beginning of string, replace with drive root
            newpath.erase(pos, 2);
          }
        }

        if (newpath.length() == 2) {
          // Whoops -- the entire string was just "X:/.." or "X:/."
          newpath.append("/");
        }
      }
#endif
      else {
        size_t pos2 = 0;
        if ((pos2 = newpath.rfind("/", pos - 1)) != string::npos) { // assignment intended
          // Remove parent directory.
          newpath.erase(pos2, pos - pos2 + 3);
        }
        else { // ../ for relative path (as in foo/../baz.txt)
          newpath.erase(0, pos + 4);
        }
      }
    }
    else { // Single /.

      // Weird path like /..foo or foo/..bar, which are NOT relative paths
      if (newpath.length() > pos + 2 && newpath[pos + 2] != '/') {
        // Do not reset `pos' -- this has to stay. Advance to the next char.
        pos++;
        continue;
      }

      newpath.erase(pos, 2);

      // Whoops -- the entire string was just "/."
      if (newpath.empty()) {
        newpath.append("/");
      }
    }